

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  ostream *poVar4;
  ostream *poVar5;
  string *in_RDI;
  ConsoleReporter *unaff_retaddr;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  iterator itEnd;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  it;
  Colour colourGuard_1;
  SourceLineInfo *in_stack_ffffffffffffff78;
  ostream *in_stack_ffffffffffffff80;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff98;
  ConsoleReporter *in_stack_ffffffffffffffa0;
  __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
  local_18;
  size_t in_stack_fffffffffffffff0;
  string *_string;
  
  _string = in_RDI;
  Option<Catch::TestCaseInfo>::operator->((Option<Catch::TestCaseInfo> *)&in_RDI[4].field_2);
  printOpenHeader(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  sVar2 = clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                    ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                     &in_RDI[10]._M_string_length);
  if (1 < sVar2) {
    Colour::Colour((Colour *)in_stack_ffffffffffffff80,
                   (Code)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::begin
              ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
               in_stack_ffffffffffffff78);
    local_18 = __gnu_cxx::
               __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
               ::operator+(in_stack_ffffffffffffff88,(difference_type)in_stack_ffffffffffffff80);
    clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::end
              ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
               in_stack_ffffffffffffff78);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                          *)in_stack_ffffffffffffff80,
                         (__normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
                          *)in_stack_ffffffffffffff78);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator*(&local_18);
      printHeaderString(unaff_retaddr,_string,in_stack_fffffffffffffff0);
      __gnu_cxx::
      __normal_iterator<Catch::SectionInfo_*,_std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>_>
      ::operator++(&local_18);
    }
    Colour::~Colour((Colour *)0xe31557);
  }
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::back
            ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
             in_stack_ffffffffffffff80);
  poVar4 = *(ostream **)((long)&in_RDI->field_2 + 8);
  pcVar3 = getLineOfChars<(char)45>();
  poVar4 = std::operator<<(poVar4,pcVar3);
  std::operator<<(poVar4,'\n');
  Colour::Colour((Colour *)in_stack_ffffffffffffff80,
                 (Code)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  poVar5 = Catch::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::operator<<((ostream *)poVar5,'\n');
  poVar4 = *(ostream **)((long)&in_RDI->field_2 + 8);
  pcVar3 = getLineOfChars<(char)46>();
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4,'\n');
  std::operator<<(poVar4,'\n');
  Colour::~Colour((Colour *)0xe3163a);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString((*it).name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << '\n';
}